

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDAWBICMetropolisSampler.cpp
# Opt level: O1

vector<double,_std::allocator<double>_> *
readHyperParam(vector<double,_std::allocator<double>_> *__return_storage_ptr__,
              string *hyperParamFilename)

{
  int iVar1;
  iterator __position;
  char *__nptr;
  char cVar2;
  istream *piVar3;
  int *piVar4;
  float fVar5;
  string token;
  double temp;
  string str;
  ifstream ifs;
  istringstream stream;
  char *local_408;
  undefined8 local_400;
  char local_3f8 [16];
  double local_3e8;
  char *local_3e0;
  undefined1 *local_3d8;
  undefined8 local_3d0;
  undefined1 local_3c8 [16];
  long local_3b8 [4];
  byte abStack_398 [488];
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  std::ifstream::ifstream(local_3b8,(string *)hyperParamFilename,_S_in);
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((abStack_398[*(long *)(local_3b8[0] + -0x18)] & 5) != 0) {
LAB_001052bf:
    std::operator<<((ostream *)&std::cout,"error");
    exit(1);
  }
  local_3d8 = local_3c8;
  local_3d0 = 0;
  local_3c8[0] = 0;
  do {
    cVar2 = std::ios::widen((char)*(undefined8 *)(local_3b8[0] + -0x18) + (char)(istream *)local_3b8
                           );
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_3b8,(string *)&local_3d8,cVar2);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) {
      if (local_3d8 != local_3c8) {
        operator_delete(local_3d8);
      }
      std::ifstream::~ifstream(local_3b8);
      return __return_storage_ptr__;
    }
    local_408 = local_3f8;
    local_400 = 0;
    local_3f8[0] = '\0';
    std::__cxx11::istringstream::istringstream(local_1b0,(string *)&local_3d8,_S_in);
    while (piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                              ((istream *)local_1b0,(string *)&local_408,'\n'), __nptr = local_408,
          ((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) == 0) {
      piVar4 = __errno_location();
      iVar1 = *piVar4;
      *piVar4 = 0;
      fVar5 = strtof(__nptr,&local_3e0);
      if (local_3e0 == __nptr) {
        std::__throw_invalid_argument("stof");
LAB_001052b3:
        std::__throw_out_of_range("stof");
        goto LAB_001052bf;
      }
      if (*piVar4 == 0) {
        *piVar4 = iVar1;
      }
      else if (*piVar4 == 0x22) goto LAB_001052b3;
      local_3e8 = (double)fVar5;
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)__return_storage_ptr__,__position,
                   &local_3e8);
      }
      else {
        *__position._M_current = local_3e8;
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
    }
    std::__cxx11::istringstream::~istringstream(local_1b0);
    std::ios_base::~ios_base(local_138);
    if (local_408 != local_3f8) {
      operator_delete(local_408);
    }
  } while( true );
}

Assistant:

vector<double> readHyperParam(string hyperParamFilename){
    ifstream ifs(hyperParamFilename);
    vector<double> param;
    if(!ifs){
        cout<<"error";
        exit(1);
    }
    string str;
    while(getline(ifs,str)){
        string token;
        istringstream stream(str);
        while(getline(stream,token,'\n')){
            double temp=stof(token);
            param.push_back(temp);
        }
    }
    return param;
}